

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log10.c
# Opt level: O1

double c_log10(double x)

{
  double dVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  int e;
  int local_34;
  double local_30;
  undefined1 local_28 [16];
  double local_10;
  
  local_28._8_4_ = in_XMM0_Dc;
  local_28._0_8_ = x;
  local_28._12_4_ = in_XMM0_Dd;
  iVar2 = isnan(x);
  if (iVar2 == 0) {
    if ((INFINITY != (double)local_28._0_8_) || (NAN(INFINITY) || NAN((double)local_28._0_8_))) {
      if ((double)local_28._0_8_ <= 0.0) {
        if (((double)local_28._0_8_ != 0.0) || (NAN((double)local_28._0_8_))) {
          mtherr(fname,1);
          local_28._0_8_ = NAN;
        }
        else {
          mtherr(fname,2);
          local_28._0_8_ = -INFINITY;
        }
      }
      else {
        dVar1 = frexp((double)local_28._0_8_,&local_34);
        uVar3 = SUB84(dVar1,0);
        uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
        if (dVar1 < 0.7071067811865476) {
          local_34 = local_34 + -1;
          dVar1 = ldexp(dVar1,1);
          uVar3 = SUB84(dVar1,0);
          uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
        }
        local_28._0_8_ = (double)CONCAT44(uVar4,uVar3) + -1.0;
        local_10 = (double)local_28._0_8_ * (double)local_28._0_8_;
        local_30 = polevl((double)local_28._0_8_,P,6);
        local_30 = local_30 * local_10;
        dVar1 = p1evl((double)local_28._0_8_,Q,6);
        local_30 = (local_30 / dVar1) * (double)local_28._0_8_;
        dVar1 = ldexp(local_10,-1);
        local_28._0_8_ =
             (double)local_34 * 0.30078125 +
             (double)local_34 * 0.0002487456639811952 +
             (double)local_28._0_8_ * 0.43359375 +
             (local_30 - dVar1) * 0.43359375 +
             ((double)local_28._0_8_ + (local_30 - dVar1)) * 0.0007007319032518276;
      }
    }
  }
  return (double)local_28._0_8_;
}

Assistant:

double c_log10(x)
double x;
{
VOLATILE double z;
double y;
#ifdef DEC
short *q;
#endif
int e;

#ifdef NANS
if( isnan(x) )
	return(x);
#endif
#ifdef INFINITIES
if( x == INFINITY )
	return(x);
#endif
/* Test for domain */
if( x <= 0.0 )
	{
	if( x == 0.0 )
	        {
		mtherr( fname, SING );
		return( -INFINITY );
	        }
	else
	        {
		mtherr( fname, DOMAIN );
		return( NAN );
	        }
	}

/* separate mantissa from exponent */

#ifdef DEC
q = (short *)&x;
e = *q;			/* short containing exponent */
e = ((e >> 7) & 0377) - 0200;	/* the exponent */
*q &= 0177;	/* strip exponent from x */
*q |= 040000;	/* x now between 0.5 and 1 */
#endif

#ifdef IBMPC
x = frexp( x, &e );
/*
q = (short *)&x;
q += 3;
e = *q;
e = ((e >> 4) & 0x0fff) - 0x3fe;
*q &= 0x0f;
*q |= 0x3fe0;
*/
#endif

/* Equivalent C language standard library function: */
#ifdef UNK
x = frexp( x, &e );
#endif

#ifdef MIEEE
x = frexp( x, &e );
#endif

/* logarithm using log(1+x) = x - .5x**2 + x**3 P(x)/Q(x) */

if( x < SQRTH )
	{
	e -= 1;
	x = ldexp( x, 1 ) - 1.0; /*  2x - 1  */
	}	
else
	{
	x = x - 1.0;
	}


/* rational form */
z = x*x;
y = x * ( z * polevl( x, P, 6 ) / p1evl( x, Q, 6 ) );
y = y - ldexp( z, -1 );   /*  y - 0.5 * x**2  */

/* multiply log of fraction by log10(e)
 * and base 2 exponent by log10(2)
 */
z = (x + y) * L10EB;  /* accumulate terms in order of size */
z += y * L10EA;
z += x * L10EA;
z += e * L102B;
z += e * L102A;


return( z );
}